

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_err_t * mpca_lang_contents(int flags,char *filename,...)

{
  char in_AL;
  FILE *__stream;
  mpc_input_t *i;
  mpc_err_t *pmVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *failure;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  mpca_grammar_st_t st;
  __va_list_tag local_118;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  mpca_grammar_st_t local_48;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  failure = "rb";
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    local_118.reg_save_area = local_f8;
    local_118.overflow_arg_area = &va[0].overflow_arg_area;
    local_118.gp_offset = 0x10;
    local_118.fp_offset = 0x30;
    local_48.parsers_num = 0;
    local_48.parsers = (mpc_parser_t **)0x0;
    local_48.va = (va_list *)&local_118;
    local_48.flags = flags;
    i = mpc_input_new_file(filename,(FILE *)__stream);
    pmVar1 = mpca_lang_st(i,&local_48);
    mpc_input_delete(i);
    free(local_48.parsers);
    fclose(__stream);
    return pmVar1;
  }
  pmVar1 = mpc_err_file(filename,failure);
  return pmVar1;
}

Assistant:

mpc_err_t *mpca_lang_contents(int flags, const char *filename, ...) {

  mpca_grammar_st_t st;
  mpc_input_t *i;
  mpc_err_t *err;

  va_list va;

  FILE *f = fopen(filename, "rb");

  if (f == NULL) {
    err = mpc_err_file(filename, "Unable to open file!");
    return err;
  }

  va_start(va, filename);

  st.va = &va;
  st.parsers_num = 0;
  st.parsers = NULL;
  st.flags = flags;

  i = mpc_input_new_file(filename, f);
  err = mpca_lang_st(i, &st);
  mpc_input_delete(i);

  free(st.parsers);
  va_end(va);

  fclose(f);

  return err;
}